

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O1

void mk_iov_free_marked(mk_iov *mk_io)

{
  int iVar1;
  long lVar2;
  
  iVar1 = mk_io->buf_idx;
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      free(mk_io->buf_to_free[lVar2]);
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  mk_io->iov_idx = 0;
  mk_io->buf_idx = 0;
  mk_io->total_len = 0;
  return;
}

Assistant:

void mk_iov_free_marked(struct mk_iov *mk_io)
{
    int i, limit = 0;

    limit = mk_io->buf_idx;

    for (i = 0; i < limit; i++) {

#ifdef DEBUG_IOV
        printf("\nDEBUG IOV :: going free (idx: %i/%i): %s", i,
               limit, mk_io->buf_to_free[i]);
        fflush(stdout);
#endif
        mk_mem_free(mk_io->buf_to_free[i]);
    }

    mk_io->iov_idx = 0;
    mk_io->buf_idx = 0;
    mk_io->total_len = 0;
}